

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.c
# Opt level: O0

void detach_for_steal(__cilkrts_worker *w,__cilkrts_worker *victim,cilk_fiber *fiber)

{
  full_frame *pfVar1;
  full_frame *pfVar2;
  __cilkrts_worker *in_RSI;
  __cilkrts_worker *in_RDI;
  bool bVar3;
  full_frame *_locked_ff_1;
  full_frame *_locked_ff;
  __cilkrts_stack_frame *sf;
  __cilkrts_stack_frame **h;
  full_frame *loot_ff;
  full_frame *child_ff;
  full_frame *parent_ff;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 uVar4;
  __cilkrts_worker *in_stack_ffffffffffffffb0;
  __cilkrts_worker *w_00;
  __cilkrts_worker *in_stack_ffffffffffffffd0;
  
  in_RDI->l->team = in_RSI->l->team;
  bVar3 = in_RDI->l->frame_ff == (full_frame *)0x0;
  uVar4 = bVar3 || in_RDI == in_RSI;
  if (!bVar3 && in_RDI != in_RSI) {
    __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/scheduler.c"
                  ,0x2e8,"w->l->frame_ff == 0 || w == victim");
  }
  pfVar1 = (full_frame *)in_RSI->head;
  if ((__cilkrts_stack_frame *)pfVar1->full_frame_magic_0 != (__cilkrts_stack_frame *)0x0) {
    in_RSI->head = (__cilkrts_stack_frame **)&pfVar1->lock;
    pfVar2 = in_RSI->l->frame_ff;
    __cilkrts_frame_lock
              (in_stack_ffffffffffffffb0,(full_frame *)CONCAT17(uVar4,in_stack_ffffffffffffffa8));
    decjoin((full_frame *)0x112d93);
    w_00 = (__cilkrts_worker *)pfVar1->full_frame_magic_0;
    pfVar1 = unroll_call_stack(in_stack_ffffffffffffffd0,pfVar1,(__cilkrts_stack_frame *)w_00);
    if ((in_RSI->l->type == WORKER_USER) && (in_RSI->l->last_full_frame == (full_frame *)0x0)) {
      set_sync_master(in_RSI,pfVar1);
    }
    if (in_RDI == in_RSI) {
      pfVar1->call_stack->flags = pfVar1->call_stack->flags | 2;
      pfVar1->simulated_stolen = 1;
    }
    else {
      __cilkrts_push_next_frame
                (in_stack_ffffffffffffffb0,(full_frame *)CONCAT17(uVar4,in_stack_ffffffffffffffa8));
    }
    pfVar2 = make_child(w_00,pfVar2,(__cilkrts_stack_frame *)in_stack_ffffffffffffffb0,
                        (cilk_fiber *)CONCAT17(uVar4,in_stack_ffffffffffffffa8));
    pfVar1 = pfVar2;
    __cilkrts_frame_lock
              ((__cilkrts_worker *)pfVar2,(full_frame *)CONCAT17(uVar4,in_stack_ffffffffffffffa8));
    incjoin(pfVar2);
    make_runnable(in_RSI,pfVar2);
    __cilkrts_frame_unlock
              ((__cilkrts_worker *)pfVar1,(full_frame *)CONCAT17(uVar4,in_stack_ffffffffffffffa8));
    __cilkrts_frame_unlock
              ((__cilkrts_worker *)pfVar1,(full_frame *)CONCAT17(uVar4,in_stack_ffffffffffffffa8));
    return;
  }
  __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/scheduler.c"
                ,0x2ec,"*h");
}

Assistant:

static void detach_for_steal(__cilkrts_worker *w,
                             __cilkrts_worker *victim,
                             cilk_fiber* fiber)
{
    /* ASSERT: we own victim->lock */

    full_frame *parent_ff, *child_ff, *loot_ff;
    __cilkrts_stack_frame *volatile *h;
    __cilkrts_stack_frame *sf;

    w->l->team = victim->l->team;

    CILK_ASSERT(w->l->frame_ff == 0 || w == victim);

    h = victim->head;

    CILK_ASSERT(*h);

    victim->head = h + 1;

    parent_ff = victim->l->frame_ff;
    BEGIN_WITH_FRAME_LOCK(w, parent_ff) {
        /* parent no longer referenced by victim */
        decjoin(parent_ff);

        /* obtain the victim call stack */
        sf = *h;

        /* perform system-dependent normalizations */
        /*__cilkrts_normalize_call_stack_on_steal(sf);*/

        /* unroll PARENT_FF with call stack SF, adopt the youngest
           frame LOOT.  If loot_ff == parent_ff, then we hold loot_ff->lock,
           otherwise, loot_ff is newly created and we can modify it without
           holding its lock. */
        loot_ff = unroll_call_stack(w, parent_ff, sf);

        #if REDPAR_DEBUG >= 3
        fprintf(stderr, "[W=%d, victim=%d, desc=detach, parent_ff=%p, loot=%p]\n",
                w->self, victim->self,
                parent_ff, loot_ff);
        #endif

        if (WORKER_USER == victim->l->type &&
            NULL == victim->l->last_full_frame) {
            // Mark this looted frame as special: only the original user worker
            // may cross the sync.
            // 
            // This call is a shared access to
            // victim->l->last_full_frame.
            set_sync_master(victim, loot_ff);
        }

        /* LOOT is the next frame that the thief W is supposed to
           run, unless the thief is stealing from itself, in which
           case the thief W == VICTIM executes CHILD and nobody
           executes LOOT. */
        if (w == victim) {
            /* Pretend that frame has been stolen */
            loot_ff->call_stack->flags |= CILK_FRAME_UNSYNCHED;
            loot_ff->simulated_stolen = 1;
        }
        else
            __cilkrts_push_next_frame(w, loot_ff);

        // After this "push_next_frame" call, w now owns loot_ff.
        child_ff = make_child(w, loot_ff, 0, fiber);

        BEGIN_WITH_FRAME_LOCK(w, child_ff) {
            /* install child in the victim's work queue, taking
               the parent_ff's place */
            /* child is referenced by victim */
            incjoin(child_ff);

            // With this call, w is bestowing ownership of the newly
            // created frame child_ff to the victim, and victim is
            // giving up ownership of parent_ff.
            //
            // Worker w will either take ownership of parent_ff
            // if parent_ff == loot_ff, or parent_ff will be
            // suspended.
            //
            // Note that this call changes the victim->frame_ff
            // while the victim may be executing.
            make_runnable(victim, child_ff);
        } END_WITH_FRAME_LOCK(w, child_ff);
    } END_WITH_FRAME_LOCK(w, parent_ff);
}